

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_dart_struct_tostring
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  e_req eVar4;
  uint uVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  reference pptVar7;
  string *psVar8;
  t_type *ptVar9;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  allocator local_221;
  string local_220;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  string local_1b8;
  allocator local_191;
  string local_190;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  byte local_119;
  undefined1 local_118 [7];
  bool can_be_null;
  undefined1 local_f8 [8];
  string field_name;
  t_field *field;
  string local_c8;
  string local_a8;
  byte local_81;
  const_iterator cStack_80;
  bool could_be_unset;
  t_field **local_78;
  byte local_69;
  const_iterator cStack_68;
  bool first;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  allocator local_41;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar6,"String toString()");
  ptVar1 = tstruct_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40," ",&local_41);
  scope_up(this,(ostream *)ptVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"StringBuffer ret = new StringBuffer(\"");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar3));
  poVar6 = std::operator<<(poVar6,"(\");");
  std::operator<<(poVar6,(string *)&endl2_abi_cxx11_);
  f_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xffffffffffffff98);
  local_69 = 1;
  local_78 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_68 = (const_iterator)local_78;
  while( true ) {
    cStack_80 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff98,&stack0xffffffffffffff80);
    if (!bVar2) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff98);
    eVar4 = t_field::get_req(*pptVar7);
    local_81 = eVar4 == T_OPTIONAL;
    if ((bool)local_81) {
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"if (");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff98);
      generate_isset_check_abi_cxx11_(&local_a8,this,*pptVar7);
      poVar6 = std::operator<<(poVar6,(string *)&local_a8);
      std::operator<<(poVar6,")");
      std::__cxx11::string::~string((string *)&local_a8);
      ptVar1 = tstruct_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8," ",(allocator *)((long)&field + 7));
      scope_up(this,(ostream *)ptVar1,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&field + 7));
    }
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffff98);
    field_name.field_2._8_8_ = *pptVar7;
    psVar8 = t_field::get_name_abi_cxx11_((t_field *)field_name.field_2._8_8_);
    std::__cxx11::string::string((string *)local_118,(string *)psVar8);
    get_member_name((string *)local_f8,this,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    if ((local_69 & 1) == 0) {
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"ret.write(\", \");");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar6 = std::operator<<(poVar6,"ret.write(\"");
    poVar6 = std::operator<<(poVar6,(string *)local_f8);
    poVar6 = std::operator<<(poVar6,":\");");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    ptVar9 = t_field::get_type((t_field *)field_name.field_2._8_8_);
    local_119 = type_can_be_null(this,ptVar9);
    if ((bool)local_119) {
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"if (this.");
      poVar6 = std::operator<<(poVar6,(string *)local_f8);
      std::operator<<(poVar6," == null)");
      ptVar1 = tstruct_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140," ",&local_141);
      scope_up(this,(ostream *)ptVar1,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"ret.write(\"null\");");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      ptVar1 = tstruct_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168," else",&local_169);
      scope_down(this,(ostream *)ptVar1,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      ptVar1 = tstruct_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190," ",&local_191);
      scope_up(this,(ostream *)ptVar1,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
    ptVar9 = t_field::get_type((t_field *)field_name.field_2._8_8_);
    uVar5 = (*(ptVar9->super_t_doc)._vptr_t_doc[7])();
    if ((uVar5 & 1) == 0) {
      ptVar9 = t_field::get_type((t_field *)field_name.field_2._8_8_);
      uVar5 = (*(ptVar9->super_t_doc)._vptr_t_doc[10])();
      if ((uVar5 & 1) == 0) {
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"ret.write(this.");
        poVar6 = std::operator<<(poVar6,(string *)local_f8);
        poVar6 = std::operator<<(poVar6,");");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"String ");
        poVar6 = std::operator<<(poVar6,(string *)local_f8);
        poVar6 = std::operator<<(poVar6,"_name = ");
        ptVar9 = t_field::get_type((t_field *)field_name.field_2._8_8_);
        get_ttype_class_name_abi_cxx11_(&local_1b8,this,ptVar9);
        poVar6 = std::operator<<(poVar6,(string *)&local_1b8);
        poVar6 = std::operator<<(poVar6,".VALUES_TO_NAMES[this.");
        poVar6 = std::operator<<(poVar6,(string *)local_f8);
        poVar6 = std::operator<<(poVar6,"];");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1b8);
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"if (");
        poVar6 = std::operator<<(poVar6,(string *)local_f8);
        std::operator<<(poVar6,"_name != null)");
        ptVar1 = tstruct_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1d8," ",&local_1d9);
        scope_up(this,(ostream *)ptVar1,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"ret.write(");
        poVar6 = std::operator<<(poVar6,(string *)local_f8);
        poVar6 = std::operator<<(poVar6,"_name);");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"ret.write(\" (\");");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        ptVar1 = tstruct_local;
        std::__cxx11::string::string((string *)&local_200,(string *)&::endl_abi_cxx11_);
        scope_down(this,(ostream *)ptVar1,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"ret.write(this.");
        poVar6 = std::operator<<(poVar6,(string *)local_f8);
        poVar6 = std::operator<<(poVar6,");");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"if (");
        poVar6 = std::operator<<(poVar6,(string *)local_f8);
        std::operator<<(poVar6,"_name != null)");
        ptVar1 = tstruct_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_220," ",&local_221);
        scope_up(this,(ostream *)ptVar1,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"ret.write(\")\");");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        ptVar1 = tstruct_local;
        std::__cxx11::string::string((string *)&local_248,(string *)&::endl_abi_cxx11_);
        scope_down(this,(ostream *)ptVar1,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
      }
    }
    else {
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"ret.write(\"BINARY\");");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    ptVar1 = tstruct_local;
    if ((local_119 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_268,(string *)&::endl_abi_cxx11_);
      scope_down(this,(ostream *)ptVar1,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
    }
    ptVar1 = tstruct_local;
    if ((local_81 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_288,(string *)&::endl_abi_cxx11_);
      scope_down(this,(ostream *)ptVar1,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
    }
    std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
    local_69 = 0;
    std::__cxx11::string::~string((string *)local_f8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffff98);
  }
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"ret.write(\")\");");
  std::operator<<(poVar6,(string *)&endl2_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"return ret.toString();");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  std::__cxx11::string::string((string *)&local_2a8,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)ptVar1,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct_tostring(ostream& out,
                                                   t_struct* tstruct) {
  indent(out) << "String toString()";
  scope_up(out);

  indent(out) << "StringBuffer ret = new StringBuffer(\""
              << tstruct->get_name() << "(\");" << endl2;

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    bool could_be_unset = (*f_iter)->get_req() == t_field::T_OPTIONAL;
    if (could_be_unset) {
      indent(out) << "if (" << generate_isset_check(*f_iter) << ")";
      scope_up(out);
    }

    t_field* field = (*f_iter);
    std::string field_name = get_member_name(field->get_name());

    if (!first) {
      indent(out) << "ret.write(\", \");" << endl;
    }
    indent(out) << "ret.write(\"" << field_name << ":\");" << endl;
    bool can_be_null = type_can_be_null(field->get_type());
    if (can_be_null) {
      indent(out) << "if (this." << field_name << " == null)";
      scope_up(out);
      indent(out) << "ret.write(\"null\");" << endl;
      scope_down(out, " else");
      scope_up(out);
    }

    if (field->get_type()->is_binary()) {
      indent(out) << "ret.write(\"BINARY\");" << endl;
    } else if (field->get_type()->is_enum()) {
      indent(out) << "String " << field_name << "_name = "
                  << get_ttype_class_name(field->get_type())
                  << ".VALUES_TO_NAMES[this." << field_name << "];" << endl;
      indent(out) << "if (" << field_name << "_name != null)";
      scope_up(out);
      indent(out) << "ret.write(" << field_name << "_name);" << endl;
      indent(out) << "ret.write(\" (\");" << endl;
      scope_down(out);
      indent(out) << "ret.write(this." << field_name << ");" << endl;
      indent(out) << "if (" << field_name << "_name != null)";
      scope_up(out);
      indent(out) << "ret.write(\")\");" << endl;
      scope_down(out);
    } else {
      indent(out) << "ret.write(this." << field_name << ");" << endl;
    }

    if (can_be_null) {
      scope_down(out);
    }
    if (could_be_unset) {
      scope_down(out);
    }

    out << endl;
    first = false;
  }

  indent(out) << "ret.write(\")\");" << endl2;

  indent(out) << "return ret.toString();" << endl;

  scope_down(out, endl2);
}